

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucm.cpp
# Opt level: O1

UBool ucm_separateMappings(UCMFile *ucm,UBool isSISO)

{
  UCMapping *pUVar1;
  UCMTable *pUVar2;
  bool bVar3;
  bool bVar4;
  UBool UVar5;
  int32_t iVar6;
  UChar32 *in_RDX;
  UChar32 *extraout_RDX;
  anon_union_4_2_095b93d3_for_b *paVar7;
  UChar32 *extraout_RDX_00;
  UChar32 *extraout_RDX_01;
  UCMapping *codePoints;
  UCMapping *m;
  
  pUVar2 = ucm->base;
  if ((long)pUVar2->mappingsLength < 1) {
    bVar3 = false;
    bVar4 = true;
  }
  else {
    m = pUVar2->mappings;
    pUVar1 = m + pUVar2->mappingsLength;
    bVar3 = true;
    bVar4 = false;
    do {
      if (((isSISO == '\0') || (m->bLen != '\x01')) || (((m->b).bytes[0] & 0xfe) != 0xe)) {
        if (m->bLen < '\x05') {
          paVar7 = &m->b;
        }
        else {
          paVar7 = (anon_union_4_2_095b93d3_for_b *)(pUVar2->bytes + (m->b).idx);
        }
        iVar6 = ucm_mappingType(&ucm->states,m,in_RDX,paVar7->bytes);
        if (iVar6 < 0) {
          codePoints = m;
          if (m->uLen != '\x01') {
            codePoints = (UCMapping *)(pUVar2->codePoints + m->u);
          }
          if (m->bLen < '\x05') {
            paVar7 = &m->b;
          }
          else {
            paVar7 = (anon_union_4_2_095b93d3_for_b *)(pUVar2->bytes + (m->b).idx);
          }
          printMapping(m,&codePoints->u,paVar7->bytes,_stderr);
          bVar3 = false;
          in_RDX = extraout_RDX_00;
        }
        else {
          in_RDX = extraout_RDX;
          if (iVar6 != 0) {
            m->moveFlag = m->moveFlag | 1;
            goto LAB_001e0196;
          }
        }
      }
      else {
        ucm_separateMappings_cold_1();
        in_RDX = extraout_RDX_01;
LAB_001e0196:
        bVar4 = true;
      }
      m = m + 1;
    } while (m < pUVar1);
    bVar3 = !bVar3;
    bVar4 = !bVar4;
  }
  if (bVar3) {
    UVar5 = '\0';
  }
  else {
    if (!bVar4) {
      ucm_moveMappings(ucm->base,ucm->ext);
      UVar5 = ucm_checkBaseExt(&ucm->states,ucm->base,ucm->ext,ucm->ext,'\0');
      return UVar5;
    }
    ucm_sortTable(ucm->base);
    UVar5 = '\x01';
  }
  return UVar5;
}

Assistant:

U_CAPI UBool U_EXPORT2
ucm_separateMappings(UCMFile *ucm, UBool isSISO) {
    UCMTable *table;
    UCMapping *m, *mLimit;
    int32_t type;
    UBool needsMove, isOK;

    table=ucm->base;
    m=table->mappings;
    mLimit=m+table->mappingsLength;

    needsMove=FALSE;
    isOK=TRUE;

    for(; m<mLimit; ++m) {
        if(isSISO && m->bLen==1 && (m->b.bytes[0]==0xe || m->b.bytes[0]==0xf)) {
            fprintf(stderr, "warning: removing illegal mapping from an SI/SO-stateful table\n");
            ucm_printMapping(table, m, stderr);
            m->moveFlag|=UCM_REMOVE_MAPPING;
            needsMove=TRUE;
            continue;
        }

        type=ucm_mappingType(
                &ucm->states, m,
                UCM_GET_CODE_POINTS(table, m), UCM_GET_BYTES(table, m));
        if(type<0) {
            /* illegal byte sequence */
            printMapping(m, UCM_GET_CODE_POINTS(table, m), UCM_GET_BYTES(table, m), stderr);
            isOK=FALSE;
        } else if(type>0) {
            m->moveFlag|=UCM_MOVE_TO_EXT;
            needsMove=TRUE;
        }
    }

    if(!isOK) {
        return FALSE;
    }
    if(needsMove) {
        ucm_moveMappings(ucm->base, ucm->ext);
        return ucm_checkBaseExt(&ucm->states, ucm->base, ucm->ext, ucm->ext, FALSE);
    } else {
        ucm_sortTable(ucm->base);
        return TRUE;
    }
}